

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void __thiscall
TCMallocImplementation::ReleaseToSystem(TCMallocImplementation *this,size_t num_bytes)

{
  SpinLock *l;
  unsigned_long *puVar1;
  PageHeap *this_00;
  Length LVar2;
  size_t bytes_released;
  unsigned_long local_40;
  ulong local_38;
  Length local_30;
  Length num_pages;
  SpinLockHolder local_20;
  SpinLockHolder h;
  size_t num_bytes_local;
  TCMallocImplementation *this_local;
  
  h.lock_ = (SpinLock *)num_bytes;
  l = tcmalloc::Static::pageheap_lock();
  SpinLockHolder::SpinLockHolder(&local_20,l);
  if ((SpinLock *)this->extra_bytes_released_ < h.lock_) {
    h.lock_ = (SpinLock *)((long)h.lock_ - this->extra_bytes_released_);
    local_38 = (ulong)h.lock_ >> 0xd;
    local_40 = 1;
    puVar1 = std::max<unsigned_long>(&local_38,&local_40);
    local_30 = *puVar1;
    this_00 = tcmalloc::Static::pageheap();
    LVar2 = tcmalloc::PageHeap::ReleaseAtLeastNPages(this_00,local_30);
    if (h.lock_ < (SpinLock *)(LVar2 * 0x2000)) {
      this->extra_bytes_released_ = (long)(LVar2 * 0x2000) - (long)h.lock_;
    }
    else {
      this->extra_bytes_released_ = 0;
    }
    num_pages._4_4_ = 0;
  }
  else {
    this->extra_bytes_released_ = this->extra_bytes_released_ - (long)h.lock_;
    num_pages._4_4_ = 1;
  }
  SpinLockHolder::~SpinLockHolder(&local_20);
  return;
}

Assistant:

virtual void ReleaseToSystem(size_t num_bytes) {
    SpinLockHolder h(Static::pageheap_lock());
    if (num_bytes <= extra_bytes_released_) {
      // We released too much on a prior call, so don't release any
      // more this time.
      extra_bytes_released_ = extra_bytes_released_ - num_bytes;
      return;
    }
    num_bytes = num_bytes - extra_bytes_released_;
    // num_bytes might be less than one page.  If we pass zero to
    // ReleaseAtLeastNPages, it won't do anything, so we release a whole
    // page now and let extra_bytes_released_ smooth it out over time.
    Length num_pages = std::max<Length>(num_bytes >> kPageShift, 1);
    size_t bytes_released = Static::pageheap()->ReleaseAtLeastNPages(
        num_pages) << kPageShift;
    if (bytes_released > num_bytes) {
      extra_bytes_released_ = bytes_released - num_bytes;
    } else {
      // The PageHeap wasn't able to release num_bytes.  Don't try to
      // compensate with a big release next time.  Specifically,
      // ReleaseFreeMemory() calls ReleaseToSystem(LONG_MAX).
      extra_bytes_released_ = 0;
    }
  }